

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVm(ExpressionContext *ctx,VmModule *module,ExprBase *expression)

{
  VmValue *pVVar1;
  
  switch(expression->typeID) {
  case 2:
    pVVar1 = CompileVmVoid(ctx,module,(ExprVoid *)expression);
    return pVVar1;
  case 3:
    pVVar1 = CompileVmBoolLiteral(ctx,module,(ExprBoolLiteral *)expression);
    return pVVar1;
  case 4:
    pVVar1 = CompileVmCharacterLiteral(ctx,module,(ExprCharacterLiteral *)expression);
    return pVVar1;
  case 5:
    pVVar1 = CompileVmStringLiteral(ctx,module,(ExprStringLiteral *)expression);
    return pVVar1;
  case 6:
    pVVar1 = CompileVmIntegerLiteral(ctx,module,(ExprIntegerLiteral *)expression);
    return pVVar1;
  case 7:
    pVVar1 = CompileVmRationalLiteral(ctx,module,(ExprRationalLiteral *)expression);
    return pVVar1;
  case 8:
    pVVar1 = CompileVmTypeLiteral(ctx,module,(ExprTypeLiteral *)expression);
    return pVVar1;
  case 9:
    pVVar1 = CompileVmNullptrLiteral(ctx,module,(ExprNullptrLiteral *)expression);
    return pVVar1;
  case 10:
    pVVar1 = CompileVmFunctionIndexLiteral(ctx,module,(ExprFunctionIndexLiteral *)expression);
    return pVVar1;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x105b,"VmValue *CompileVm(ExpressionContext &, VmModule *, ExprBase *)");
  case 0xe:
    pVVar1 = CompileVmPassthrough(ctx,module,(ExprPassthrough *)expression);
    return pVVar1;
  case 0xf:
    pVVar1 = CompileVmArray(ctx,module,(ExprArray *)expression);
    return pVVar1;
  case 0x10:
    pVVar1 = CompileVmPreModify(ctx,module,(ExprPreModify *)expression);
    return pVVar1;
  case 0x11:
    pVVar1 = CompileVmPostModify(ctx,module,(ExprPostModify *)expression);
    return pVVar1;
  case 0x12:
    pVVar1 = CompileVmTypeCast(ctx,module,(ExprTypeCast *)expression);
    return pVVar1;
  case 0x13:
    pVVar1 = CompileVmUnaryOp(ctx,module,(ExprUnaryOp *)expression);
    return pVVar1;
  case 0x14:
    pVVar1 = CompileVmBinaryOp(ctx,module,(ExprBinaryOp *)expression);
    return pVVar1;
  case 0x15:
    pVVar1 = CompileVmGetAddress(ctx,module,(ExprGetAddress *)expression);
    return pVVar1;
  case 0x16:
    pVVar1 = CompileVmDereference(ctx,module,(ExprDereference *)expression);
    return pVVar1;
  case 0x17:
    pVVar1 = CompileVmUnboxing(ctx,module,(ExprUnboxing *)expression);
    return pVVar1;
  case 0x18:
    pVVar1 = CompileVmConditional(ctx,module,(ExprConditional *)expression);
    return pVVar1;
  case 0x19:
    pVVar1 = CompileVmAssignment(ctx,module,(ExprAssignment *)expression);
    return pVVar1;
  case 0x1a:
    pVVar1 = CompileVmMemberAccess(ctx,module,(ExprMemberAccess *)expression);
    return pVVar1;
  case 0x1b:
    pVVar1 = CompileVmArrayIndex(ctx,module,(ExprArrayIndex *)expression);
    return pVVar1;
  case 0x1c:
    pVVar1 = CompileVmReturn(ctx,module,(ExprReturn *)expression);
    return pVVar1;
  case 0x1d:
    pVVar1 = CompileVmYield(ctx,module,(ExprYield *)expression);
    return pVVar1;
  case 0x1e:
    pVVar1 = CompileVmVariableDefinition(ctx,module,(ExprVariableDefinition *)expression);
    return pVVar1;
  case 0x1f:
    pVVar1 = CompileVmZeroInitialize(ctx,module,(ExprZeroInitialize *)expression);
    return pVVar1;
  case 0x20:
    pVVar1 = CompileVmArraySetup(ctx,module,(ExprArraySetup *)expression);
    return pVVar1;
  case 0x21:
    pVVar1 = CompileVmVariableDefinitions(ctx,module,(ExprVariableDefinitions *)expression);
    return pVVar1;
  case 0x22:
    pVVar1 = CompileVmVariableAccess(ctx,module,(ExprVariableAccess *)expression);
    return pVVar1;
  case 0x23:
    pVVar1 = CompileVmFunctionContextAccess(ctx,module,(ExprFunctionContextAccess *)expression);
    return pVVar1;
  case 0x24:
    pVVar1 = CompileVmFunctionDefinition(ctx,module,(ExprFunctionDefinition *)expression);
    return pVVar1;
  case 0x25:
    pVVar1 = CompileVmGenericFunctionPrototype
                       (ctx,module,(ExprGenericFunctionPrototype *)expression);
    return pVVar1;
  case 0x26:
    pVVar1 = CompileVmFunctionAccess(ctx,module,(ExprFunctionAccess *)expression);
    return pVVar1;
  case 0x29:
    pVVar1 = CompileVmFunctionCall(ctx,module,(ExprFunctionCall *)expression);
    return pVVar1;
  case 0x2a:
    pVVar1 = CompileVmAliasDefinition(ctx,module,(ExprAliasDefinition *)expression);
    return pVVar1;
  case 0x2b:
    pVVar1 = CompileVmClassPrototype(ctx,module,(ExprClassPrototype *)expression);
    return pVVar1;
  case 0x2c:
    pVVar1 = CompileVmGenericClassPrototype(ctx,module,(ExprGenericClassPrototype *)expression);
    return pVVar1;
  case 0x2d:
    pVVar1 = CompileVmClassDefinition(ctx,module,(ExprClassDefinition *)expression);
    return pVVar1;
  case 0x2e:
    pVVar1 = CompileVmEnumDefinition(ctx,module,(ExprEnumDefinition *)expression);
    return pVVar1;
  case 0x2f:
    pVVar1 = CompileVmIfElse(ctx,module,(ExprIfElse *)expression);
    return pVVar1;
  case 0x30:
    pVVar1 = CompileVmFor(ctx,module,(ExprFor *)expression);
    return pVVar1;
  case 0x31:
    pVVar1 = CompileVmWhile(ctx,module,(ExprWhile *)expression);
    return pVVar1;
  case 0x32:
    pVVar1 = CompileVmDoWhile(ctx,module,(ExprDoWhile *)expression);
    return pVVar1;
  case 0x33:
    pVVar1 = CompileVmSwitch(ctx,module,(ExprSwitch *)expression);
    return pVVar1;
  case 0x34:
    pVVar1 = CompileVmBreak(ctx,module,(ExprBreak *)expression);
    return pVVar1;
  case 0x35:
    pVVar1 = CompileVmContinue(ctx,module,(ExprContinue *)expression);
    return pVVar1;
  case 0x36:
    pVVar1 = CompileVmBlock(ctx,module,(ExprBlock *)expression);
    return pVVar1;
  case 0x37:
    pVVar1 = CompileVmSequence(ctx,module,(ExprSequence *)expression);
    return pVVar1;
  }
}

Assistant:

VmValue* CompileVm(ExpressionContext &ctx, VmModule *module, ExprBase *expression)
{
	switch(expression->typeID)
	{
	case ExprVoid::myTypeID:
		return CompileVmVoid(ctx, module, (ExprVoid*)expression);
	case ExprBoolLiteral::myTypeID:
		return CompileVmBoolLiteral(ctx, module, (ExprBoolLiteral*)expression);
	case ExprCharacterLiteral::myTypeID:
		return CompileVmCharacterLiteral(ctx, module, (ExprCharacterLiteral*)expression);
	case ExprStringLiteral::myTypeID:
		return CompileVmStringLiteral(ctx, module, (ExprStringLiteral*)expression);
	case ExprIntegerLiteral::myTypeID:
		return CompileVmIntegerLiteral(ctx, module, (ExprIntegerLiteral*)expression);
	case ExprRationalLiteral::myTypeID:
		return CompileVmRationalLiteral(ctx, module, (ExprRationalLiteral*)expression);
	case ExprTypeLiteral::myTypeID:
		return CompileVmTypeLiteral(ctx, module, (ExprTypeLiteral*)expression);
	case ExprNullptrLiteral::myTypeID:
		return CompileVmNullptrLiteral(ctx, module, (ExprNullptrLiteral*)expression);
	case ExprFunctionIndexLiteral::myTypeID:
		return CompileVmFunctionIndexLiteral(ctx, module, (ExprFunctionIndexLiteral*)expression);
	case ExprPassthrough::myTypeID:
		return CompileVmPassthrough(ctx, module, (ExprPassthrough*)expression);
	case ExprArray::myTypeID:
		return CompileVmArray(ctx, module, (ExprArray*)expression);
	case ExprPreModify::myTypeID:
		return CompileVmPreModify(ctx, module, (ExprPreModify*)expression);
	case ExprPostModify::myTypeID:
		return CompileVmPostModify(ctx, module, (ExprPostModify*)expression);
	case ExprTypeCast::myTypeID:
		return CompileVmTypeCast(ctx, module, (ExprTypeCast*)expression);
	case ExprUnaryOp::myTypeID:
		return CompileVmUnaryOp(ctx, module, (ExprUnaryOp*)expression);
	case ExprBinaryOp::myTypeID:
		return CompileVmBinaryOp(ctx, module, (ExprBinaryOp*)expression);
	case ExprGetAddress::myTypeID:
		return CompileVmGetAddress(ctx, module, (ExprGetAddress*)expression);
	case ExprDereference::myTypeID:
		return CompileVmDereference(ctx, module, (ExprDereference*)expression);
	case ExprUnboxing::myTypeID:
		return CompileVmUnboxing(ctx, module, (ExprUnboxing*)expression);
	case ExprConditional::myTypeID:
		return CompileVmConditional(ctx, module, (ExprConditional*)expression);
	case ExprAssignment::myTypeID:
		return CompileVmAssignment(ctx, module, (ExprAssignment*)expression);
	case ExprMemberAccess::myTypeID:
		return CompileVmMemberAccess(ctx, module, (ExprMemberAccess*)expression);
	case ExprArrayIndex::myTypeID:
		return CompileVmArrayIndex(ctx, module, (ExprArrayIndex*)expression);
	case ExprReturn::myTypeID:
		return CompileVmReturn(ctx, module, (ExprReturn*)expression);
	case ExprYield::myTypeID:
		return CompileVmYield(ctx, module, (ExprYield*)expression);
	case ExprVariableDefinition::myTypeID:
		return CompileVmVariableDefinition(ctx, module, (ExprVariableDefinition*)expression);
	case ExprZeroInitialize::myTypeID:
		return CompileVmZeroInitialize(ctx, module, (ExprZeroInitialize*)expression);
	case ExprArraySetup::myTypeID:
		return CompileVmArraySetup(ctx, module, (ExprArraySetup*)expression);
	case ExprVariableDefinitions::myTypeID:
		return CompileVmVariableDefinitions(ctx, module, (ExprVariableDefinitions*)expression);
	case ExprVariableAccess::myTypeID:
		return CompileVmVariableAccess(ctx, module, (ExprVariableAccess*)expression);
	case ExprFunctionContextAccess::myTypeID:
		return CompileVmFunctionContextAccess(ctx, module, (ExprFunctionContextAccess*)expression);
	case ExprFunctionDefinition::myTypeID:
		return CompileVmFunctionDefinition(ctx, module, (ExprFunctionDefinition*)expression);
	case ExprGenericFunctionPrototype::myTypeID:
		return CompileVmGenericFunctionPrototype(ctx, module, (ExprGenericFunctionPrototype*)expression);
	case ExprFunctionAccess::myTypeID:
		return CompileVmFunctionAccess(ctx, module, (ExprFunctionAccess*)expression);
	case ExprFunctionCall::myTypeID:
		return CompileVmFunctionCall(ctx, module, (ExprFunctionCall*)expression);
	case ExprAliasDefinition::myTypeID:
		return CompileVmAliasDefinition(ctx, module, (ExprAliasDefinition*)expression);
	case ExprClassPrototype::myTypeID:
		return CompileVmClassPrototype(ctx, module, (ExprClassPrototype*)expression);
	case ExprGenericClassPrototype::myTypeID:
		return CompileVmGenericClassPrototype(ctx, module, (ExprGenericClassPrototype*)expression);
	case ExprClassDefinition::myTypeID:
		return CompileVmClassDefinition(ctx, module, (ExprClassDefinition*)expression);
	case ExprEnumDefinition::myTypeID:
		return CompileVmEnumDefinition(ctx, module, (ExprEnumDefinition*)expression);
	case ExprIfElse::myTypeID:
		return CompileVmIfElse(ctx, module, (ExprIfElse*)expression);
	case ExprFor::myTypeID:
		return CompileVmFor(ctx, module, (ExprFor*)expression);
	case ExprWhile::myTypeID:
		return CompileVmWhile(ctx, module, (ExprWhile*)expression);
	case ExprDoWhile::myTypeID:
		return CompileVmDoWhile(ctx, module, (ExprDoWhile*)expression);
	case ExprSwitch::myTypeID:
		return CompileVmSwitch(ctx, module, (ExprSwitch*)expression);
	case ExprBreak::myTypeID:
		return CompileVmBreak(ctx, module, (ExprBreak*)expression);
	case ExprContinue::myTypeID:
		return CompileVmContinue(ctx, module, (ExprContinue*)expression);
	case ExprBlock::myTypeID:
		return CompileVmBlock(ctx, module, (ExprBlock*)expression);
	case ExprSequence::myTypeID:
		return CompileVmSequence(ctx, module, (ExprSequence*)expression);
	}

	assert(!"unknown type");

	return NULL;
}